

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O1

int signo3(int A,int B)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  bool bVar4;
  
  iVar3 = tq + tp;
  if (iVar3 == 0 || SCARRY4(tq,tp) != iVar3 < 0) {
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
    iVar1 = 1;
    do {
      uVar2 = uVar2 ^ A >> ((byte)iVar1 & 0x1f);
      bVar4 = iVar1 != iVar3;
      iVar1 = iVar1 + 1;
    } while (bVar4);
  }
  uVar2 = (A & B) >> ((byte)tp & 0x1f) ^ uVar2 & B;
  uVar2 = (int)uVar2 >> 8 ^ uVar2;
  uVar2 = (int)uVar2 >> 4 ^ uVar2;
  uVar2 = (int)uVar2 >> 2 ^ uVar2;
  return -((uVar2 >> 1 ^ uVar2) & 1) | 1;
}

Assistant:

int signo3(int A,int B)
{
	
	int tA2=0,n=(tp+tq); 
	for(int i=1;i<=n;i++)
		tA2^=(A>>i);

	tA2&=B;
	tA2^=(A&B)>>tp;
	tA2^=(tA2>>8);
	tA2^=(tA2>>4);
	tA2^=(tA2>>2);
	tA2^=(tA2>>1);
		
	if(tA2&1)return -1;
	return 1;
}